

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-trainer-CH.cc
# Opt level: O3

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *ppiVar1;
  uint uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer ppNVar5;
  Node *pNVar6;
  undefined1 auVar7 [16];
  RNNBuilder *pRVar8;
  int *piVar9;
  undefined1 auVar10 [8];
  LookupParameters *p;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar11;
  RNNLanguageModel<cnn::FastLSTMBuilder> *pRVar12;
  pointer pEVar13;
  Tensor *pTVar14;
  ExecutionEngine *pEVar15;
  ulong uVar16;
  long lVar17;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  undefined1 auVar29 [64];
  undefined1 extraout_var [56];
  undefined1 auVar30 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar33;
  undefined7 in_stack_00000019;
  char in_stack_00000020;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  Expression i_l;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  undefined1 local_428 [8];
  pointer pEStack_420;
  ComputationGraph *local_418;
  uint local_410;
  uint uStack_40c;
  uint local_408;
  undefined4 uStack_404;
  uint local_400;
  ComputationGraph *local_3f8;
  uint local_3f0;
  ComputationGraph *local_3e8;
  uint local_3e0;
  undefined1 local_3d0 [8];
  size_type local_3c8;
  undefined1 local_3c0 [24];
  undefined8 local_3a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_3a0;
  LookupParameters *local_398;
  long local_390;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_388;
  ulong local_380;
  RNNBuilder *local_378;
  undefined1 local_370 [24];
  uint local_358;
  undefined1 local_350 [24];
  uint local_338;
  ComputationGraph *local_330;
  Expression *local_328;
  ExecutionEngine *local_320;
  vector<int,_std::allocator<int>_> *local_318;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_310;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2f8;
  initializer_list<cnn::expr::Expression> local_2e0;
  Expression local_2d0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2c0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_2a8;
  initializer_list<cnn::expr::Expression> local_290;
  undefined1 local_280 [24];
  undefined4 local_268;
  undefined1 local_260 [24];
  undefined4 local_248;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_240;
  Expression *local_228;
  ulong local_220;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_218;
  initializer_list<cnn::expr::Expression> local_200;
  undefined1 local_1f0 [24];
  uint local_1d8;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_1d0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_1b8;
  RNNLanguageModel<cnn::FastLSTMBuilder> *local_1a0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_198;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_180;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_168;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_150;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_138;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_120;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_108;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  undefined4 local_a8;
  undefined1 local_a0 [24];
  uint local_88;
  undefined1 local_80 [24];
  uint local_68;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppiVar1 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  pvVar4 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
  }
  local_3a0 = labels;
  local_330 = cg;
  local_328 = (Expression *)ppiVar1;
  local_320 = (ExecutionEngine *)chars;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  local_418 = (ComputationGraph *)0x0;
  local_428 = (undefined1  [8])0x0;
  pEStack_420 = (pointer)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  ppiVar1 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  if (((ulong)sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 1;
  }
  local_228 = (Expression *)ppiVar1;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  local_418 = (ComputationGraph *)0x0;
  local_428 = (undefined1  [8])0x0;
  pEStack_420 = (pointer)0x0;
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  pvVar22 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)((long)pvVar3 - (long)pvVar4 >> 2);
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  cnn::expr::parameter((ComputationGraph *)(local_260 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_350 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_260,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_350,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_280 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_370 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_280,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_370,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_80 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_80,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_a0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_a0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_c0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&local_60,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_c0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_d0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_e0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_1f0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_1f0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_f0,(Parameters *)cor);
  uVar16 = (ulong)pvVar22 & 0xffffffff;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_1b8,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_310,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_2a8,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_180,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_108,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_1d0,uVar16,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_120,uVar16,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_198,uVar16,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_138,uVar16,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2c0,uVar16,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2f8,uVar16,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_150,uVar16,(allocator_type *)local_428);
  local_1a0 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_168,uVar16,(allocator_type *)local_428);
  local_398 = (LookupParameters *)cor;
  local_318 = sent;
  local_220 = uVar16;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_240,uVar16,(allocator_type *)local_428);
  auVar29 = ZEXT864(0) << 0x40;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)pvVar22 != 0) {
    local_380 = (ulong)pvVar22 & 0xffffffff;
    uVar16 = 0;
    local_388 = pvVar22;
    do {
      p = local_398;
      cnn::expr::lookup((ComputationGraph *)local_428,local_398,
                        (uint)(local_318->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar16].pg = (ComputationGraph *)local_428;
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar16].i.t = pEStack_420._0_4_;
      if (eval == false) {
        auVar29 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)local_428,
                           local_1b8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar16,pdrop);
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16].pg = (ComputationGraph *)local_428;
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar16].i.t = pEStack_420._0_4_;
      }
      pRVar8 = (RNNBuilder *)(uVar16 * 0x18);
      pvVar3 = (local_3a0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_3a8 = uVar16;
      local_390 = uVar16 * 0x10;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_310.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,
                 *(long *)((long)&(pRVar8->cur).t + (long)pvVar3) -
                 *(long *)((long)&pRVar8->_vptr_RNNBuilder + (long)pvVar3) >> 2);
      uVar19 = local_3a8;
      pvVar3 = (local_3a0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar3[local_3a8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar3[local_3a8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar26 = 1;
        uVar25 = 0;
        do {
          uVar23 = uVar26;
          cnn::expr::lookup((ComputationGraph *)local_428,p,
                            (uint)(local_318->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                  .super__Vector_impl_data._M_finish);
          pEVar13 = local_310.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar13[uVar25].pg = (ComputationGraph *)local_428;
          pEVar13[uVar25].i.t = pEStack_420._0_4_;
          if (eval == false) {
            auVar29 = ZEXT464((uint)pdrop);
            cnn::expr::dropout((expr *)local_428,
                               local_310.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar19].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar25,pdrop);
            pEVar13 = local_310.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar13[uVar25].pg = (ComputationGraph *)local_428;
            pEVar13[uVar25].i.t = pEStack_420._0_4_;
          }
          pvVar3 = (local_3a0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar26 = (ulong)((int)uVar23 + 1);
          uVar25 = uVar23;
        } while (uVar23 < (ulong)((long)pvVar3[uVar19].super__Vector_base<int,_std::allocator<int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  *(long *)&pvVar3[uVar19].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data >> 2));
      }
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_2a8.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_180.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_108.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16,
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_310.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      pEVar13 = local_310.
                super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19].
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar17 = (long)local_310.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar19].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar13;
      local_378 = pRVar8;
      if (lVar17 != 0) {
        uVar16 = lVar17 >> 4;
        lVar24 = 0;
        uVar26 = 0;
        do {
          dVar28 = auVar29._0_8_;
          if (lVar24 == 0) {
            if (uVar16 < 2) {
              local_428 = (undefined1  [8])local_280._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_268);
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)pEVar13->pg;
              uStack_404 = (undefined4)((ulong)pEVar13->pg >> 0x20);
              local_400 = (pEVar13->i).t;
              local_3c8 = 5;
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_280._0_8_;
              local_3e0 = local_280._8_4_;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else if (lVar17 == 0x20) {
              local_428 = (undefined1  [8])local_280._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_268);
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)pEVar13->pg;
              uStack_404 = (undefined4)((ulong)pEVar13->pg >> 0x20);
              local_400 = (pEVar13->i).t;
              local_3f8 = pEVar13[1].pg;
              local_3f0 = pEVar13[1].i.t;
              local_3c8 = 5;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else {
              local_428 = (undefined1  [8])local_280._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_268);
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)pEVar13->pg;
              uStack_404 = (undefined4)((ulong)pEVar13->pg >> 0x20);
              local_400 = (pEVar13->i).t;
              local_3f8 = pEVar13[1].pg;
              local_3f0 = pEVar13[1].i.t;
              local_3e8 = pEVar13[2].pg;
              local_3e0 = pEVar13[2].i.t;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            pEVar13 = local_2a8.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar13->pg = (ComputationGraph *)local_3c0._0_8_;
            (pEVar13->i).t = local_3c0._8_4_;
          }
          else if (lVar24 == 0x10) {
            if (uVar16 < 3) {
              local_428 = (undefined1  [8])local_370._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_358);
              local_418 = pEVar13->pg;
              local_410 = (pEVar13->i).t;
              local_408 = (uint)pEVar13[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar13[1].pg >> 0x20);
              local_400 = pEVar13[1].i.t;
              local_3c8 = 5;
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_280._0_8_;
              local_3e0 = local_280._8_4_;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else if (uVar16 == 3) {
              local_428 = (undefined1  [8])local_370._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_358);
              local_418 = pEVar13->pg;
              local_410 = (pEVar13->i).t;
              local_408 = (uint)pEVar13[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar13[1].pg >> 0x20);
              local_400 = pEVar13[1].i.t;
              local_3f8 = pEVar13[2].pg;
              local_3f0 = pEVar13[2].i.t;
              local_3c8 = 5;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else {
              local_428 = (undefined1  [8])local_370._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_358);
              local_418 = pEVar13->pg;
              local_410 = (pEVar13->i).t;
              local_408 = (uint)pEVar13[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar13[1].pg >> 0x20);
              local_400 = pEVar13[1].i.t;
              local_3f8 = pEVar13[2].pg;
              local_3f0 = pEVar13[2].i.t;
              local_3e8 = pEVar13[3].pg;
              local_3e0 = pEVar13[3].i.t;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            pEVar13 = local_2a8.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar13[1].pg = (ComputationGraph *)local_3c0._0_8_;
            pEVar13[1].i.t = local_3c0._8_4_;
          }
          else {
            if (uVar26 + 1 < uVar16) {
              if (uVar26 + 2 < uVar16) {
                local_428 = *(undefined1 (*) [8])((long)&pEVar13[0xfffffffffffffffe].pg + lVar24);
                pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                                *(undefined4 *)((long)pEVar13 + lVar24 + -0x18));
                local_418 = *(ComputationGraph **)((long)&pEVar13[0xffffffffffffffff].pg + lVar24);
                local_410 = *(uint *)((long)pEVar13 + lVar24 + -8);
                uVar18 = *(undefined8 *)((long)&pEVar13->pg + lVar24);
                local_408 = (uint)uVar18;
                uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
                local_400 = *(undefined4 *)((long)&(pEVar13->i).t + lVar24);
                local_3f8 = *(ComputationGraph **)((long)&pEVar13[1].pg + lVar24);
                local_3f0 = *(uint *)((long)&pEVar13[1].i.t + lVar24);
                local_3e8 = *(ComputationGraph **)((long)&pEVar13[2].pg + lVar24);
                local_3e0 = *(uint *)((long)&pEVar13[2].i.t + lVar24);
                local_3c8 = 5;
                local_3d0 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0)
                ;
              }
              else {
                local_428 = *(undefined1 (*) [8])((long)&pEVar13[0xfffffffffffffffe].pg + lVar24);
                pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                                *(undefined4 *)((long)pEVar13 + lVar24 + -0x18));
                local_418 = *(ComputationGraph **)((long)&pEVar13[0xffffffffffffffff].pg + lVar24);
                local_410 = *(uint *)((long)pEVar13 + lVar24 + -8);
                uVar18 = *(undefined8 *)((long)&pEVar13->pg + lVar24);
                local_408 = (uint)uVar18;
                uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
                local_400 = *(undefined4 *)((long)&(pEVar13->i).t + lVar24);
                local_3f8 = *(ComputationGraph **)((long)&pEVar13[1].pg + lVar24);
                local_3f0 = *(uint *)((long)&pEVar13[1].i.t + lVar24);
                local_3c8 = 5;
                local_3e8 = (ComputationGraph *)local_370._0_8_;
                local_3e0 = local_370._8_4_;
                local_3d0 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0)
                ;
              }
            }
            else {
              local_428 = *(undefined1 (*) [8])((long)&pEVar13[0xfffffffffffffffe].pg + lVar24);
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                              *(undefined4 *)((long)pEVar13 + lVar24 + -0x18));
              local_418 = *(ComputationGraph **)((long)&pEVar13[0xffffffffffffffff].pg + lVar24);
              local_410 = *(uint *)((long)pEVar13 + lVar24 + -8);
              uVar18 = *(undefined8 *)((long)&pEVar13->pg + lVar24);
              local_408 = (uint)uVar18;
              uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
              local_400 = *(undefined4 *)((long)&(pEVar13->i).t + lVar24);
              local_3c8 = 5;
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_280._0_8_;
              local_3e0 = local_280._8_4_;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            pEVar13 = local_2a8.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar19].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pEVar13->pg + lVar24) = local_3c0._0_8_;
            *(undefined4 *)((long)&(pEVar13->i).t + lVar24) = local_3c0._8_4_;
          }
          local_428 = (undefined1  [8])local_80._0_8_;
          local_418 = (ComputationGraph *)local_80._16_8_;
          local_410 = local_68;
          pEVar13 = local_2a8.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = *(undefined8 *)((long)&pEVar13->pg + lVar24);
          local_408 = (uint)uVar18;
          uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
          local_400 = *(undefined4 *)((long)&(pEVar13->i).t + lVar24);
          local_290._M_len = 3;
          local_290._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d0,&local_290);
          dVar28 = cnn::expr::tanh((expr *)local_3c0,dVar28);
          pEVar13 = local_180.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar13->pg + lVar24) = local_3c0._0_8_;
          *(undefined4 *)((long)&(pEVar13->i).t + lVar24) = local_3c0._8_4_;
          local_428 = (undefined1  [8])local_c0._16_8_;
          pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_a8);
          local_418 = (ComputationGraph *)local_a0._16_8_;
          local_410 = local_88;
          pEVar13 = local_180.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = *(undefined8 *)((long)&pEVar13->pg + lVar24);
          local_408 = (uint)uVar18;
          uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
          local_400 = *(uint *)((long)&(pEVar13->i).t + lVar24);
          local_3f8 = (ComputationGraph *)local_a0._0_8_;
          local_3f0 = local_a0._8_4_;
          local_3e8 = *(ComputationGraph **)
                       ((long)&(local_1b8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + local_390);
          local_3e0 = *(uint *)((long)&((local_1b8.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t +
                               local_390);
          local_290._M_len = 5;
          local_290._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d0,&local_290);
          dVar28 = cnn::expr::tanh((expr *)local_3c0,dVar28);
          pEVar13 = local_108.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar19].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar13->pg + lVar24) = local_3c0._0_8_;
          *(undefined4 *)((long)&(pEVar13->i).t + lVar24) = local_3c0._8_4_;
          cnn::expr::operator*
                    ((expr *)local_3c0,&local_60,
                     (Expression *)
                     ((long)&(local_108.
                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar19].
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24));
          auVar29._0_8_ = cnn::expr::exp((expr *)local_428,dVar28);
          auVar29._8_56_ = extraout_var;
          uVar26 = uVar26 + 1;
          lVar17 = *(long *)((long)&((local_1d0.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)local_378);
          *(undefined1 (*) [8])(lVar17 + lVar24) = local_428;
          *(uint *)(lVar17 + 8 + lVar24) = pEStack_420._0_4_;
          lVar24 = lVar24 + 0x10;
          pEVar13 = *(pointer *)
                     ((long)&((local_310.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             )._M_impl.super__Vector_impl_data._M_start + (long)local_378);
          lVar17 = *(long *)((long)&((local_310.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + (long)local_378) -
                   (long)pEVar13;
          uVar16 = lVar17 >> 4;
        } while (uVar26 < uVar16);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19);
      pRVar8 = local_378;
      *(undefined1 (*) [8])
       ((long)&(local_120.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + local_390) = local_428;
      *(uint *)((long)&((local_120.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + local_390) =
           pEStack_420._0_4_;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 ((long)&((local_198.
                           super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)local_378),
                 *(long *)((long)&((local_310.
                                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + (long)local_378) -
                 *(long *)((long)&((local_310.
                                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (long)local_378) >> 4
                );
      if (local_310.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar19].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_310.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar19].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar16 = 0;
        uVar26 = 1;
        do {
          lVar24 = uVar16 * 0x10;
          lVar17 = *(long *)((long)&((local_180.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pRVar8);
          cnn::expr::cdiv((expr *)local_3c0,
                          (Expression *)
                          (*(long *)((long)&((local_1d0.
                                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            )._M_impl.super__Vector_impl_data._M_start +
                                    (long)pRVar8) + lVar24),
                          (Expression *)
                          ((long)&(local_120.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + local_390));
          cnn::expr::cwise_multiply
                    ((expr *)local_428,(Expression *)(lVar17 + lVar24),(Expression *)local_3c0);
          lVar17 = *(long *)((long)&((local_198.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pRVar8);
          *(undefined1 (*) [8])(lVar17 + lVar24) = local_428;
          *(uint *)(lVar17 + 8 + lVar24) = pEStack_420._0_4_;
          bVar27 = uVar26 < (ulong)(*(long *)((long)&((local_310.
                                                                                                              
                                                  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                             (long)pRVar8) -
                                    *(long *)((long)&((local_310.
                                                                                                              
                                                  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                             (long)pRVar8) >> 4);
          uVar16 = uVar26;
          uVar26 = (ulong)((int)uVar26 + 1);
        } while (bVar27);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 local_198.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar19);
      pvVar22 = local_388;
      *(undefined1 (*) [8])
       ((long)&(local_138.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + local_390) = local_428;
      uVar16 = local_3a8 + 1;
      *(uint *)((long)&((local_138.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + local_390) =
           pEStack_420._0_4_;
    } while (uVar16 != local_380);
    uVar20 = (uint)local_388;
    if (uVar20 != 0) {
      lVar24 = 0;
      lVar17 = local_380 << 4;
      do {
        local_428 = *(undefined1 (*) [8])
                     ((long)&(local_138.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
        pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                        *(undefined4 *)
                                         ((long)&((local_138.
                                                                                                      
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                         lVar24));
        local_418 = *(ComputationGraph **)
                     ((long)&(local_1b8.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
        local_410 = *(uint *)((long)&((local_1b8.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar24);
        local_3c8 = 2;
        local_3d0 = (undefined1  [8])local_428;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
        *(undefined8 *)
         ((long)&(local_2c0.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start)->pg + lVar24) = local_3c0._0_8_;
        *(undefined4 *)
         ((long)&((local_2c0.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar24) = local_3c0._8_4_;
        lVar24 = lVar24 + 0x10;
      } while (lVar17 != lVar24);
      if (uVar20 != 0) {
        uVar16 = 2;
        lVar24 = 0;
        do {
          if (lVar24 == 0) {
            if ((uint)local_388 == 2) {
              local_428 = (undefined1  [8])local_260._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_248);
              local_418 = (ComputationGraph *)local_350._16_8_;
              local_410 = local_338;
              local_408 = (uint)(local_2c0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2c0.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].pg;
              local_3f0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3e8 = (ComputationGraph *)local_350._0_8_;
              local_3e0 = local_350._8_4_;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else if ((uint)local_388 == 1) {
              local_428 = (undefined1  [8])local_260._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_248);
              local_418 = (ComputationGraph *)local_350._16_8_;
              local_410 = local_338;
              local_408 = (uint)(local_2c0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2c0.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = (ComputationGraph *)local_350._0_8_;
              local_3f0 = local_350._8_4_;
              local_3e8 = (ComputationGraph *)local_260._0_8_;
              local_3e0 = local_260._8_4_;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else {
              local_428 = (undefined1  [8])local_260._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_248);
              local_418 = (ComputationGraph *)local_350._16_8_;
              local_410 = local_338;
              local_408 = (uint)(local_2c0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2c0.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].pg;
              local_3f0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3e8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3e0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            (local_2f8.
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start)->pg = (ComputationGraph *)local_3c0._0_8_;
            ((local_2f8.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start)->i).t = local_3c0._8_4_;
          }
          else if (lVar24 == 0x10) {
            if (uVar20 < 3) {
              local_428 = (undefined1  [8])local_350._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_338);
              local_418 = (local_2c0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2c0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = (ComputationGraph *)local_350._0_8_;
              local_3f0 = local_350._8_4_;
              local_3e8 = (ComputationGraph *)local_260._0_8_;
              local_3e0 = local_260._8_4_;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else if ((uint)local_388 < 4) {
              local_428 = (undefined1  [8])local_350._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_338);
              local_418 = (local_2c0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2c0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3f0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3e8 = (ComputationGraph *)local_350._0_8_;
              local_3e0 = local_350._8_4_;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            else {
              local_428 = (undefined1  [8])local_350._16_8_;
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_338);
              local_418 = (local_2c0.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2c0.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2c0.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3f0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3e8 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].pg;
              local_3e0 = local_2c0.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].i.t;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            local_2f8.
            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start[1].pg = (ComputationGraph *)local_3c0._0_8_;
            local_2f8.
            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start[1].i.t = local_3c0._8_4_;
          }
          else {
            if (uVar16 - 1 < ((ulong)pvVar22 & 0xffffffff)) {
              if (uVar16 < ((ulong)pvVar22 & 0xffffffff)) {
                local_428 = *(undefined1 (*) [8])
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar24);
                pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                                *(undefined4 *)
                                                 ((long)local_2c0.
                                                                                                                
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar24 + -0x18));
                local_418 = *(ComputationGraph **)
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar24);
                local_410 = *(uint *)((long)local_2c0.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8)
                ;
                uVar18 = *(undefined8 *)
                          ((long)&(local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
                local_408 = (uint)uVar18;
                uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
                local_400 = *(uint *)((long)&((local_2c0.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar24);
                local_3f8 = *(ComputationGraph **)
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar24);
                local_3f0 = *(uint *)((long)&local_2c0.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].i.t +
                                     lVar24);
                local_3e8 = *(ComputationGraph **)
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2].pg + lVar24);
                local_3e0 = *(uint *)((long)&local_2c0.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].i.t +
                                     lVar24);
                local_3c8 = 5;
                local_3d0 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0)
                ;
              }
              else {
                local_428 = *(undefined1 (*) [8])
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar24);
                pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                                *(undefined4 *)
                                                 ((long)local_2c0.
                                                                                                                
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                 lVar24 + -0x18));
                local_418 = *(ComputationGraph **)
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar24);
                local_410 = *(uint *)((long)local_2c0.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8)
                ;
                uVar18 = *(undefined8 *)
                          ((long)&(local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
                local_408 = (uint)uVar18;
                uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
                local_400 = *(uint *)((long)&((local_2c0.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar24);
                local_3f8 = *(ComputationGraph **)
                             ((long)&local_2c0.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar24);
                local_3f0 = *(uint *)((long)&local_2c0.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].i.t +
                                     lVar24);
                local_3e8 = (ComputationGraph *)local_350._0_8_;
                local_3e0 = local_350._8_4_;
                local_3c8 = 5;
                local_3d0 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0)
                ;
              }
            }
            else {
              local_428 = *(undefined1 (*) [8])
                           ((long)&local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar24);
              pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                              *(undefined4 *)
                                               ((long)local_2c0.
                                                                                                            
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               lVar24 + -0x18));
              local_418 = *(ComputationGraph **)
                           ((long)&local_2c0.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar24);
              local_410 = *(uint *)((long)local_2c0.
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar24 + -8);
              uVar18 = *(undefined8 *)
                        ((long)&(local_2c0.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
              local_408 = (uint)uVar18;
              uStack_404 = (undefined4)((ulong)uVar18 >> 0x20);
              local_400 = *(uint *)((long)&((local_2c0.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                   lVar24);
              local_3f8 = (ComputationGraph *)local_350._0_8_;
              local_3f0 = local_350._8_4_;
              local_3e8 = (ComputationGraph *)local_260._0_8_;
              local_3e0 = local_260._8_4_;
              local_3c8 = 5;
              local_3d0 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0);
            }
            *(undefined8 *)
             ((long)&(local_2f8.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24) = local_3c0._0_8_;
            *(undefined4 *)
             ((long)&((local_2f8.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar24) = local_3c0._8_4_;
          }
          pvVar11 = local_388;
          lVar24 = lVar24 + 0x10;
          uVar16 = uVar16 + 1;
        } while (lVar17 != lVar24);
        iVar21 = (int)local_388;
        if (iVar21 != 0) {
          lVar24 = 0;
          do {
            cnn::RNNBuilder::add_input((RNNBuilder *)local_428,local_328);
            *(undefined1 (*) [8])
             ((long)&(local_150.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24) = local_428;
            *(uint *)((long)&((local_150.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar24) =
                 pEStack_420._0_4_;
            lVar24 = lVar24 + 0x10;
          } while (lVar17 != lVar24);
          pvVar22 = pvVar11;
          if (iVar21 != 0) {
            do {
              pvVar22 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)((long)&pvVar22[-1].
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
              uVar16 = (ulong)pvVar22 & 0xffffffff;
              cnn::RNNBuilder::add_input((RNNBuilder *)local_428,local_228);
              local_380 = local_380 - 1;
              local_168.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar16].pg = (ComputationGraph *)local_428;
              local_168.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar16].i.t = pEStack_420._0_4_;
            } while (local_380 != 0);
            local_380 = 0;
            if (iVar21 != 0) {
              lVar24 = 0;
              do {
                local_428 = *(undefined1 (*) [8])
                             ((long)&(local_150.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
                pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,
                                                *(undefined4 *)
                                                 ((long)&((local_150.
                                                                                                                      
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                                 lVar24));
                local_418 = *(ComputationGraph **)
                             ((long)&(local_168.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24);
                local_410 = *(uint *)((long)&((local_168.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar24);
                local_3c8 = 2;
                local_3d0 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c0,(initializer_list<cnn::expr::Expression> *)local_3d0)
                ;
                *(undefined8 *)
                 ((long)&(local_240.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar24) = local_3c0._0_8_
                ;
                *(undefined4 *)
                 ((long)&((local_240.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar24) =
                     local_3c0._8_4_;
                lVar24 = lVar24 + 0x10;
              } while (lVar17 != lVar24);
              if (iVar21 != 0) {
                local_3a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)0x0;
                local_378 = (RNNBuilder *)(local_318 + 0x18);
                local_388 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)((ulong)pvVar11 & 0xffffffff);
                local_390 = (long)local_388 << 4;
                do {
                  pRVar8 = local_378;
                  if (((ulong)local_318[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xfffffffd00000000) == 0) {
                    *(undefined4 *)
                     ((long)&local_318[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4) = 1;
                  }
                  (*local_378->_vptr_RNNBuilder[9])(local_378,local_398);
                  auVar30 = ZEXT864(0) << 0x40;
                  local_418 = (ComputationGraph *)0x0;
                  local_428 = (undefined1  [8])0x0;
                  pEStack_420 = (pointer)0x0;
                  cnn::RNNBuilder::start_new_sequence
                            (pRVar8,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     *)local_428);
                  if (local_428 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_428);
                  }
                  pvVar22 = local_3a0;
                  if (in_stack_00000020 == '\0') {
                    uStack_40c = 1;
                    local_408 = 1;
                    local_428._0_4_ = HIDDEN_DIM;
                    cnn::expr::zeroes((expr *)local_3d0,(ComputationGraph *)local_398,
                                      (Dim *)local_428);
                    local_3a8 = local_3a8 & 0xffffffff00000000;
                    do {
                      if (6 < (int)local_3a8) break;
                      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
                      vector((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              *)local_3c0,local_220,(allocator_type *)local_428);
                      lVar17 = 0;
                      do {
                        dVar28 = auVar30._0_8_;
                        cnn::expr::operator*
                                  ((expr *)&local_50,(Expression *)local_c0,
                                   (Expression *)
                                   ((long)&(local_240.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar17)
                                  );
                        cnn::expr::operator*
                                  ((expr *)&local_200,(Expression *)local_d0,(Expression *)local_3d0
                                  );
                        cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200);
                        auVar30._0_8_ = cnn::expr::tanh((expr *)&local_290,dVar28);
                        auVar30._8_56_ = extraout_var_02;
                        cnn::expr::operator*
                                  ((expr *)local_428,(Expression *)local_e0,(Expression *)&local_290
                                  );
                        dVar28 = auVar30._0_8_;
                        *(undefined1 (*) [8])
                         ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                  local_3c0._0_8_)->
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar17) = local_428;
                        *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                          local_3c0._0_8_)->
                                         super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + lVar17) =
                             pEStack_420._0_4_;
                        lVar17 = lVar17 + 0x10;
                      } while (local_390 != lVar17);
                      cnn::expr::detail::
                      f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                ((detail *)&local_290,&local_240);
                      cnn::expr::detail::
                      f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                ((detail *)local_428,
                                 (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  *)local_3c0);
                      cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
                      cnn::expr::transpose((expr *)&local_200,&local_40);
                      cnn::expr::transpose((expr *)&local_2d0,(Expression *)&local_290);
                      cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2d0);
                      cnn::expr::transpose((expr *)local_428,&local_50);
                      local_200._M_len = 2;
                      local_418 = (ComputationGraph *)local_428;
                      local_410 = pEStack_420._0_4_;
                      local_428 = (undefined1  [8])
                                  local_240.
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)local_3a0].pg;
                      local_200._M_array = (iterator)local_428;
                      pEStack_420._0_4_ =
                           local_240.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)local_3a0].i.t;
                      cnn::expr::detail::
                      f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                                ((detail *)&local_50,&local_200);
                      cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_378);
                      local_400 = pEStack_420._0_4_;
                      auVar10 = local_428;
                      local_2e0._M_len = 3;
                      local_3d0 = local_428;
                      local_428 = (undefined1  [8])local_1f0._0_8_;
                      pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_1f0._8_4_);
                      local_418 = (ComputationGraph *)local_1f0._16_8_;
                      local_410 = local_1d8;
                      local_408 = auVar10._0_4_;
                      uStack_404 = auVar10._4_4_;
                      local_3c8 = CONCAT44(local_3c8._4_4_,local_400);
                      local_2e0._M_array = (iterator)local_428;
                      cnn::expr::detail::
                      f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                                ((detail *)&local_2d0,&local_2e0);
                      auVar30._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar28);
                      auVar30._8_56_ = extraout_var_03;
                      cnn::expr::operator*
                                ((expr *)&local_2d0,(Expression *)local_f0,(Expression *)&local_200)
                      ;
                      if (predict == (uint *)0x0) {
                        bVar27 = true;
                      }
                      else {
                        pTVar14 = cnn::ComputationGraph::incremental_forward
                                            ((ComputationGraph *)local_398);
                        cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar14);
                        if ((long)pEStack_420 - (long)local_428 == 0) {
                          uVar20 = 0xffffffff;
                        }
                        else {
                          auVar30 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                          lVar17 = (long)pEStack_420 - (long)local_428 >> 2;
                          uVar19 = 0xffffffff;
                          uVar16 = 0;
                          do {
                            auVar32._0_8_ =
                                 (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar16 * 4);
                            auVar32._8_8_ = in_XMM2_Qb;
                            dVar28 = auVar30._0_8_;
                            auVar7 = vmaxsd_avx(auVar32,auVar30._0_16_);
                            auVar30 = ZEXT1664(auVar7);
                            if (dVar28 < auVar32._0_8_) {
                              uVar19 = uVar16 & 0xffffffff;
                            }
                            uVar20 = (uint)uVar19;
                            uVar16 = uVar16 + 1;
                          } while (lVar17 + (ulong)(lVar17 == 0) != uVar16);
                        }
                        ppNVar5 = (local_330->nodes).
                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        pNVar6 = ppNVar5[(long)local_3a0 * 3];
                        lVar17 = (long)ppNVar5[(long)local_3a0 * 3 + 1] - (long)pNVar6;
                        if ((ulong)(long)(int)local_3a8 < (ulong)(lVar17 >> 2)) {
                          uVar2 = (pNVar6->dim).d[(long)(int)local_3a8 - 8];
                          if (uVar2 == uVar20) {
                            auVar30 = ZEXT864((ulong)(*(double *)predict + 1.0));
                            *(double *)predict = *(double *)predict + 1.0;
                          }
                          cnn::expr::pickneglogsoftmax((expr *)&local_2e0,&local_2d0,uVar2);
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_2e0)
                          ;
                        }
                        else {
                          cnn::expr::pickneglogsoftmax
                                    ((expr *)&local_2e0,&local_2d0,
                                     *(uint *)((long)pNVar6 + lVar17 + -4));
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_2e0)
                          ;
                        }
                        bVar27 = uVar20 != endlabel;
                        if (local_428 != (undefined1  [8])0x0) {
                          operator_delete((void *)local_428);
                        }
                        local_3a8 = CONCAT44(local_3a8._4_4_,(int)local_3a8 + 1);
                      }
                      if ((ComputationGraph *)local_3c0._0_8_ != (ComputationGraph *)0x0) {
                        operator_delete((void *)local_3c0._0_8_);
                      }
                      pvVar22 = local_3a0;
                    } while (bVar27);
                    if (overall != (uint *)0x0) {
                      *overall = *overall + (int)local_3a8;
                    }
                    piVar9 = (int *)CONCAT71(in_stack_00000019,train);
                    if (piVar9 != (int *)0x0) {
                      ppNVar5 = (local_330->nodes).
                                super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      *piVar9 = *piVar9 + (int)((ulong)((long)ppNVar5[(long)pvVar22 * 3 + 1] -
                                                       (long)ppNVar5[(long)pvVar22 * 3]) >> 2);
                    }
                  }
                  else {
                    uStack_40c = 1;
                    local_408 = 1;
                    local_428._0_4_ = HIDDEN_DIM;
                    cnn::expr::zeroes((expr *)local_3d0,(ComputationGraph *)local_398,
                                      (Dim *)local_428);
                    local_380 = (long)pvVar22 * 3;
                    ppNVar5 = (local_330->nodes).
                              super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (ppNVar5[(long)pvVar22 * 3 + 1] == ppNVar5[(long)pvVar22 * 3]) {
                      pEVar15 = (ExecutionEngine *)0x0;
                      local_3a8 = (ulong)local_3a8._4_4_ << 0x20;
                    }
                    else {
                      local_328 = (Expression *)((long)pvVar22 << 4);
                      local_320 = (ExecutionEngine *)0x0;
                      local_3a8 = (ulong)local_3a8._4_4_ << 0x20;
                      do {
                        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
                        vector((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                *)local_3c0,local_220,(allocator_type *)local_428);
                        lVar17 = 0;
                        do {
                          dVar28 = auVar30._0_8_;
                          cnn::expr::operator*
                                    ((expr *)&local_50,(Expression *)local_c0,
                                     (Expression *)
                                     ((long)&(local_240.
                                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->pg +
                                     lVar17));
                          cnn::expr::operator*
                                    ((expr *)&local_200,(Expression *)local_d0,
                                     (Expression *)local_3d0);
                          cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200)
                          ;
                          auVar30._0_8_ = cnn::expr::tanh((expr *)&local_290,dVar28);
                          auVar30._8_56_ = extraout_var_00;
                          cnn::expr::operator*
                                    ((expr *)local_428,(Expression *)local_e0,
                                     (Expression *)&local_290);
                          dVar28 = auVar30._0_8_;
                          *(undefined1 (*) [8])
                           ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                    local_3c0._0_8_)->
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar17) = local_428;
                          *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                            local_3c0._0_8_)->
                                           super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + lVar17) =
                               pEStack_420._0_4_;
                          lVar17 = lVar17 + 0x10;
                        } while (local_390 != lVar17);
                        cnn::expr::detail::
                        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                  ((detail *)&local_290,&local_240);
                        cnn::expr::detail::
                        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                  ((detail *)local_428,
                                   (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    *)local_3c0);
                        cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
                        cnn::expr::transpose((expr *)&local_200,&local_40);
                        cnn::expr::transpose((expr *)&local_2d0,(Expression *)&local_290);
                        cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2d0);
                        cnn::expr::transpose((expr *)local_428,&local_50);
                        local_200._M_len = 2;
                        local_418 = (ComputationGraph *)local_428;
                        local_410 = pEStack_420._0_4_;
                        local_428 = (undefined1  [8])
                                    *(ComputationGraph **)
                                     ((long)&(local_240.
                                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->pg +
                                     (long)local_328);
                        local_200._M_array = (iterator)local_428;
                        pEStack_420._0_4_ =
                             *(uint *)((long)&((local_240.
                                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                      (long)local_328);
                        cnn::expr::detail::
                        f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                                  ((detail *)&local_50,&local_200);
                        cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_378);
                        local_400 = pEStack_420._0_4_;
                        auVar10 = local_428;
                        local_2e0._M_len = 3;
                        local_3d0 = local_428;
                        local_428 = (undefined1  [8])local_1f0._0_8_;
                        pEStack_420 = (pointer)CONCAT44(pEStack_420._4_4_,local_1f0._8_4_);
                        local_418 = (ComputationGraph *)local_1f0._16_8_;
                        local_410 = local_1d8;
                        local_408 = auVar10._0_4_;
                        uStack_404 = auVar10._4_4_;
                        local_3c8 = CONCAT44(local_3c8._4_4_,local_400);
                        local_2e0._M_array = (iterator)local_428;
                        cnn::expr::detail::
                        f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                                  ((detail *)&local_2d0,&local_2e0);
                        auVar30._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar28);
                        auVar30._8_56_ = extraout_var_01;
                        cnn::expr::operator*
                                  ((expr *)&local_2d0,(Expression *)local_f0,
                                   (Expression *)&local_200);
                        pvVar22 = local_3a0;
                        if (predict != (uint *)0x0) {
                          pTVar14 = cnn::ComputationGraph::incremental_forward
                                              ((ComputationGraph *)local_398);
                          cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar14)
                          ;
                          if ((long)pEStack_420 - (long)local_428 == 0) {
                            uVar20 = 0xffffffff;
                          }
                          else {
                            auVar30 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                            lVar17 = (long)pEStack_420 - (long)local_428 >> 2;
                            uVar19 = 0xffffffff;
                            uVar16 = 0;
                            do {
                              auVar31._0_8_ =
                                   (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar16 * 4);
                              auVar31._8_8_ = in_XMM2_Qb;
                              dVar28 = auVar30._0_8_;
                              auVar7 = vmaxsd_avx(auVar31,auVar30._0_16_);
                              auVar30 = ZEXT1664(auVar7);
                              if (dVar28 < auVar31._0_8_) {
                                uVar19 = uVar16 & 0xffffffff;
                              }
                              uVar20 = (uint)uVar19;
                              uVar16 = uVar16 + 1;
                            } while (lVar17 + (ulong)(lVar17 == 0) != uVar16);
                          }
                          uVar2 = ((local_330->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[local_380]->dim).d
                                  [(long)&local_320[-1].cg];
                          if (uVar2 == uVar20) {
                            auVar30 = ZEXT864((ulong)(*(double *)predict + 1.0));
                            *(double *)predict = *(double *)predict + 1.0;
                          }
                          cnn::expr::pickneglogsoftmax((expr *)&local_2e0,&local_2d0,uVar2);
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>(&local_218,(Expression *)&local_2e0)
                          ;
                          if (local_428 != (undefined1  [8])0x0) {
                            operator_delete((void *)local_428);
                          }
                          local_3a8 = CONCAT44(local_3a8._4_4_,(int)local_3a8 + 1);
                        }
                        if ((ComputationGraph *)local_3c0._0_8_ != (ComputationGraph *)0x0) {
                          operator_delete((void *)local_3c0._0_8_);
                        }
                        local_320 = (ExecutionEngine *)(long)(int)local_3a8;
                        ppNVar5 = (local_330->nodes).
                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        pEVar15 = (ExecutionEngine *)
                                  ((long)ppNVar5[local_380 + 1] - (long)ppNVar5[local_380] >> 2);
                      } while (local_320 < pEVar15);
                    }
                    if (overall != (uint *)0x0) {
                      *overall = *overall + (int)local_3a8;
                    }
                    piVar9 = (int *)CONCAT71(in_stack_00000019,train);
                    if (piVar9 != (int *)0x0) {
                      *piVar9 = *piVar9 + (int)pEVar15;
                    }
                  }
                  local_3a0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)((long)&(pvVar22->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1);
                } while (local_3a0 != local_388);
              }
            }
          }
        }
      }
    }
  }
  pRVar12 = local_1a0;
  cnn::expr::detail::
  f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((detail *)local_1a0,&local_218);
  if (local_218.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_240.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_240.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2c0.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c0.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_198);
  if (local_120.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_1d0);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_2a8);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_310);
  uVar18 = extraout_RDX;
  if (local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar18 = extraout_RDX_00;
  }
  EVar33._8_8_ = uVar18;
  EVar33.pg = (ComputationGraph *)pRVar12;
  return EVar33;
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    
    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 7) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }